

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

ngram_model_t * ps_get_lm(ps_decoder_t *ps,char *name)

{
  int iVar1;
  ps_search_t *ppVar2;
  
  ppVar2 = ps_find_search(ps,name);
  if ((ppVar2 != (ps_search_t *)0x0) && (iVar1 = strcmp("ngram",ppVar2->type), iVar1 == 0)) {
    return (ngram_model_t *)ppVar2[1].vt;
  }
  return (ngram_model_t *)0x0;
}

Assistant:

ngram_model_t *
ps_get_lm(ps_decoder_t *ps, const char *name)
{
    ps_search_t *search =  ps_find_search(ps, name);
    if (search == NULL)
        return NULL;
    if (0 != strcmp(PS_SEARCH_TYPE_NGRAM, ps_search_type(search)))
        return NULL;
    return ((ngram_search_t *) search)->lmset;
}